

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_detector.cc
# Opt level: O3

void __thiscall
webrtc::TransientDetector::TransientDetector(TransientDetector *this,int sample_rate_hz)

{
  float *pfVar1;
  _Elt_pointer pfVar2;
  WPDTree *this_00;
  MovingMoments *this_01;
  float *pfVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float local_3c;
  unique_ptr<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_> *local_38;
  
  this->samples_per_chunk_ = (long)(sample_rate_hz / 100);
  local_38 = &this->wpd_tree_;
  (this->wpd_tree_)._M_t.
  super___uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::WPDTree_*,_std::default_delete<webrtc::WPDTree>_>.
  super__Head_base<0UL,_webrtc::WPDTree_*,_false>._M_head_impl = (WPDTree *)0x0;
  memset(this->moving_moments_,0,0xe0);
  std::_Deque_base<float,_std::allocator<float>_>::_M_initialize_map
            (&(this->previous_results_).super__Deque_base<float,_std::allocator<float>_>,0);
  this->chunks_at_startup_left_to_delete_ = 3;
  this->reference_energy_ = 1.0;
  this->using_reference_ = false;
  if (sample_rate_hz < 32000) {
    if ((sample_rate_hz == 8000) || (sample_rate_hz == 16000)) {
LAB_00187223:
      uVar7 = this->samples_per_chunk_;
      uVar8 = uVar7 & 0xfffffffffffffff8;
      this->samples_per_chunk_ = uVar8;
      this->tree_leaves_data_length_ = uVar7 >> 3;
      this_00 = (WPDTree *)operator_new(0x18);
      WPDTree::WPDTree(this_00,uVar8,(float *)kDaubechies8HighPassCoefficients,
                       (float *)kDaubechies8LowPassCoefficients,0x10,3);
      std::__uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_>::reset
                ((__uniq_ptr_impl<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_> *)local_38
                 ,this_00);
      lVar5 = 0;
      do {
        this_01 = (MovingMoments *)operator_new(0x60);
        MovingMoments::MovingMoments(this_01,(ulong)((uint)(sample_rate_hz * 0x1e) / 8000));
        std::__uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>::
        reset((__uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_> *
              )((long)&this->moving_moments_[0]._M_t.
                       super___uniq_ptr_impl<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_webrtc::MovingMoments_*,_std::default_delete<webrtc::MovingMoments>_>
                       .super__Head_base<0UL,_webrtc::MovingMoments_*,_false>._M_head_impl + lVar5),
              this_01);
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x40);
      uVar8 = this->tree_leaves_data_length_;
      uVar7 = uVar8 * 4;
      pfVar3 = (float *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar7);
      pfVar1 = (this->first_moments_)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->first_moments_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
      if (pfVar1 != (float *)0x0) {
        operator_delete__(pfVar1);
        uVar8 = this->tree_leaves_data_length_;
        uVar7 = uVar8 * 4;
      }
      uVar6 = 0xffffffffffffffff;
      if (uVar8 < 0x4000000000000000) {
        uVar6 = uVar7;
      }
      pfVar3 = (float *)operator_new__(uVar6);
      pfVar1 = (this->second_moments_)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->second_moments_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
      if (pfVar1 != (float *)0x0) {
        operator_delete__(pfVar1);
      }
      iVar4 = 3;
      do {
        local_3c = 0.0;
        pfVar2 = (this->previous_results_).super__Deque_base<float,_std::allocator<float>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pfVar2 == (this->previous_results_).super__Deque_base<float,_std::allocator<float>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<float,_std::allocator<float>_>::_M_push_back_aux<float>
                    (&this->previous_results_,&local_3c);
        }
        else {
          *pfVar2 = 0.0;
          (this->previous_results_).super__Deque_base<float,_std::allocator<float>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = pfVar2 + 1;
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      return;
    }
  }
  else if ((sample_rate_hz == 32000) || (sample_rate_hz == 48000)) goto LAB_00187223;
  __assert_fail("sample_rate_hz == ts::kSampleRate8kHz || sample_rate_hz == ts::kSampleRate16kHz || sample_rate_hz == ts::kSampleRate32kHz || sample_rate_hz == ts::kSampleRate48kHz"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_detector.cc"
                ,0x2a,"webrtc::TransientDetector::TransientDetector(int)");
}

Assistant:

TransientDetector::TransientDetector(int sample_rate_hz)
    : samples_per_chunk_(sample_rate_hz * ts::kChunkSizeMs / 1000),
      last_first_moment_(),
      last_second_moment_(),
      chunks_at_startup_left_to_delete_(kChunksAtStartupLeftToDelete),
      reference_energy_(1.f),
      using_reference_(false) {
  assert(sample_rate_hz == ts::kSampleRate8kHz ||
         sample_rate_hz == ts::kSampleRate16kHz ||
         sample_rate_hz == ts::kSampleRate32kHz ||
         sample_rate_hz == ts::kSampleRate48kHz);
  int samples_per_transient = sample_rate_hz * kTransientLengthMs / 1000;
  // Adjustment to avoid data loss while downsampling, making
  // |samples_per_chunk_| and |samples_per_transient| always divisible by
  // |kLeaves|.
  samples_per_chunk_ -= samples_per_chunk_ % kLeaves;
  samples_per_transient -= samples_per_transient % kLeaves;

  tree_leaves_data_length_ = samples_per_chunk_ / kLeaves;
  wpd_tree_.reset(new WPDTree(samples_per_chunk_,
                              kDaubechies8HighPassCoefficients,
                              kDaubechies8LowPassCoefficients,
                              kDaubechies8CoefficientsLength,
                              kLevels));
  for (size_t i = 0; i < kLeaves; ++i) {
    moving_moments_[i].reset(
        new MovingMoments(samples_per_transient / kLeaves));
  }

  first_moments_.reset(new float[tree_leaves_data_length_]);
  second_moments_.reset(new float[tree_leaves_data_length_]);

  for (int i = 0; i < kChunksAtStartupLeftToDelete; ++i) {
    previous_results_.push_back(0.f);
  }
}